

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  Vec_Int_t *p;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  int Entry;
  int i;
  
  __s = Extra_FileReadContents(pFileName);
  sVar5 = strlen(__s);
  bVar3 = false;
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  p = Vec_IntAlloc(vNames->nSize);
  Entry = -1;
  bVar2 = true;
  pcVar6 = __s;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\n') {
      Entry = ((int)pcVar6 - (int)__s) + 1;
LAB_003383f7:
      bVar3 = false;
    }
    else if (cVar1 == '/') {
      if (pcVar6[1] == '/') {
        bVar3 = true;
      }
    }
    else {
      if (cVar1 == '\0') {
        if (p->nSize == vNames->nSize * 2) {
          free(__s);
          return p;
        }
        __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x40e,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
      }
      if (!bVar3) {
        if (cVar1 != '(') goto LAB_003383f7;
        if (!bVar2) {
          pcVar6 = strtok(pcVar6 + 1,"  \n\r\t,");
          for (i = 0; i < vNames->nSize; i = i + 1) {
            pcVar7 = (char *)Vec_PtrEntry(vNames,i);
            iVar4 = strcmp(pcVar7,pcVar6);
            if (iVar4 == 0) {
              Vec_IntPush(p,Entry);
              Vec_IntPush(p,i);
            }
          }
          sVar8 = strlen(pcVar6);
          pcVar6 = pcVar6 + (sVar8 - 1);
          do {
            pcVar7 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
          } while (*pcVar7 == '\0');
          if (__s + sVar5 <= pcVar6) {
            __assert_fail("pTemp < pLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                          ,0x40a,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
          }
        }
        bVar3 = false;
        bVar2 = false;
      }
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1, fComment = 0;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            fComment = 0;
        if ( *pTemp == '/' && *(pTemp + 1) == '/' )
            fComment = 1;
        if ( fComment )
            continue;

        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t," );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}